

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::calculate_four_particle_correlation_Cn4
          (singleParticleSpectra *this,vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *corr,
          vector<double,_std::allocator<double>_> *corr_err)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double *pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  ostream *this_00;
  pretty_ostream *this_01;
  int iVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  allocator local_39;
  string local_38;
  
  pdVar6 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = *pdVar6;
  iVar10 = this->num_Cn4;
  iVar5 = this->order_max;
  pdVar7 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (corr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (corr_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  while( true ) {
    if ((uint)(iVar10 * 2) == uVar11) {
      return;
    }
    if (iVar5 < (int)uVar11) break;
    dVar12 = *(double *)((long)pdVar6 + uVar11 * 4);
    dVar2 = *(double *)((long)pdVar7 + uVar11 * 4);
    dVar3 = pdVar6[uVar11];
    dVar4 = pdVar7[uVar11];
    dVar13 = dVar12 * dVar12 + dVar2 * dVar2;
    dVar12 = (dVar3 * dVar12 + dVar2 * dVar4) * dVar12 + (dVar4 * dVar12 - dVar2 * dVar3) * dVar2;
    dVar12 = (dVar13 * dVar13 - (dVar12 + dVar12)) + (dVar1 + -2.0) * -4.0 * dVar13 +
             dVar3 * dVar3 + dVar4 * dVar4 + (dVar1 + -3.0) * (dVar1 + dVar1);
    *(double *)((long)pdVar8 + uVar11 * 4) = *(double *)((long)pdVar8 + uVar11 * 4) + dVar12;
    *(double *)((long)pdVar9 + uVar11 * 4) =
         dVar12 * dVar12 + *(double *)((long)pdVar9 + uVar11 * 4);
    uVar11 = uVar11 + 2;
  }
  this_01 = &this->messager;
  std::operator<<((ostream *)this_01,"Error: the vn needed for C_n{4} is not ");
  std::operator<<((ostream *)this_01,"computed, order_max = ");
  this_00 = (ostream *)pretty_ostream::operator<<(this_01,&this->order_max);
  std::operator<<(this_00,"2n = ");
  std::ostream::operator<<(this_00,(int)uVar11);
  std::operator<<(this_00,". Make sure order_max > 2n!");
  std::__cxx11::string::string((string *)&local_38,"error",&local_39);
  pretty_ostream::flush(this_01,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

void singleParticleSpectra::calculate_four_particle_correlation_Cn4(
    vector<double> &event_Qn_real, vector<double> &event_Qn_imag,
    vector<double> &corr, vector<double> &corr_err) {
    // C_n[0] = N(N-1)(N-2)(N-3) is the number of pairs
    double dN = event_Qn_real[0];
    for (int i = 0; i < num_Cn4; i++) {
        int ii = 2 * i;
        if (ii > order_max) {
            messager << "Error: the vn needed for C_n{4} is not "
                     << "computed, order_max = " << order_max << "2n = " << ii
                     << ". Make sure order_max > 2n!";
            messager.flush("error");
            exit(1);
        }
        double abs_Qn_2 =
            (event_Qn_real[i] * event_Qn_real[i]
             + event_Qn_imag[i] * event_Qn_imag[i]);
        double abs_Q2n_2 =
            (event_Qn_real[ii] * event_Qn_real[ii]
             + event_Qn_imag[ii] * event_Qn_imag[ii]);

        double Re_Q2n_QnQn =
            (event_Qn_real[i]
                 * (event_Qn_real[ii] * event_Qn_real[i]
                    + event_Qn_imag[ii] * event_Qn_imag[i])
             + event_Qn_imag[i]
                   * (event_Qn_real[i] * event_Qn_imag[ii]
                      - event_Qn_real[ii] * event_Qn_imag[i]));

        double corr_local =
            (abs_Qn_2 * abs_Qn_2 - 2. * Re_Q2n_QnQn - 4. * (dN - 2.) * abs_Qn_2
             + abs_Q2n_2 + 2. * dN * (dN - 3.));
        corr[i] += corr_local;
        corr_err[i] += corr_local * corr_local;
    }
}